

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O2

_Bool duckdb_je_fxp_parse(fxp_t *result,char *str,char **end)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  long lVar4;
  int iVar5;
  char *cur;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  bool bVar10;
  
  bVar3 = *str;
  if (bVar3 != 0x2e && 9 < (byte)(bVar3 - 0x30)) {
    return true;
  }
  uVar7 = 0;
  pbVar6 = (byte *)(str + 1);
  while ((byte)(bVar3 - 0x30) < 10) {
    uVar7 = (uint)(byte)(bVar3 - 0x30) + uVar7 * 10;
    if (0xffff < uVar7) {
      return true;
    }
    bVar3 = *pbVar6;
    pbVar6 = pbVar6 + 1;
  }
  if (bVar3 == 0x2e) {
    if (9 < (byte)(*pbVar6 - 0x30)) {
      return true;
    }
    iVar5 = 0xe;
    lVar4 = 0;
    while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
      bVar3 = *pbVar6;
      bVar9 = bVar3 - 0x30;
      pbVar6 = pbVar6 + (bVar9 < 10);
      lVar8 = (ulong)bVar3 - 0x30;
      if (9 < bVar9) {
        lVar8 = 0;
      }
      lVar4 = lVar4 * 10 + lVar8;
    }
    pbVar6 = pbVar6 + -1;
    do {
      pbVar1 = pbVar6 + 1;
      pbVar6 = pbVar6 + 1;
    } while ((byte)(*pbVar1 - 0x30) < 10);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = lVar4 << 0x10;
    *result = uVar7 * 0x10000 + SUB164(auVar2 / ZEXT816(100000000000000),0);
    if (end == (char **)0x0) {
      return false;
    }
  }
  else {
    *result = uVar7 << 0x10;
    if (end == (char **)0x0) {
      return false;
    }
    pbVar6 = pbVar6 + -1;
  }
  *end = (char *)pbVar6;
  return false;
}

Assistant:

bool
fxp_parse(fxp_t *result, const char *str, char **end) {
	/*
	 * Using malloc_strtoumax in this method isn't as handy as you might
	 * expect (I tried). In the fractional part, significant leading zeros
	 * mean that you still need to do your own parsing, now with trickier
	 * math.  In the integer part, the casting (uintmax_t to uint32_t)
	 * forces more reasoning about bounds than just checking for overflow as
	 * we parse.
	 */
	uint32_t integer_part = 0;

	const char *cur = str;

	/* The string must start with a digit or a decimal point. */
	if (*cur != '.' && !fxp_isdigit(*cur)) {
		return true;
	}

	while ('0' <= *cur && *cur <= '9') {
		integer_part *= 10;
		integer_part += *cur - '0';
		if (integer_part >= (1U << 16)) {
			return true;
		}
		cur++;
	}

	/*
	 * We've parsed all digits at the beginning of the string, without
	 * overflow.  Either we're done, or there's a fractional part.
	 */
	if (*cur != '.') {
		*result = (integer_part << 16);
		if (end != NULL) {
			*end = (char *)cur;
		}
		return false;
	}

	/* There's a fractional part. */
	cur++;
	if (!fxp_isdigit(*cur)) {
		/* Shouldn't end on the decimal point. */
		return true;
	}

	/*
	 * We use a lot of precision for the fractional part, even though we'll
	 * discard most of it; this lets us get exact values for the important
	 * special case where the denominator is a small power of 2 (for
	 * instance, 1/512 == 0.001953125 is exactly representable even with
	 * only 16 bits of fractional precision).  We need to left-shift by 16
	 * before dividing so we pick the number of digits to be
	 * floor(log(2**48)) = 14.
	 */
	uint64_t fractional_part = 0;
	uint64_t frac_div = 1;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		fractional_part *= 10;
		frac_div *= 10;
		if (fxp_isdigit(*cur)) {
			fractional_part += *cur - '0';
			cur++;
		}
	}
	/*
	 * We only parse the first maxdigits characters, but we can still ignore
	 * any digits after that.
	 */
	while (fxp_isdigit(*cur)) {
		cur++;
	}

	assert(fractional_part < frac_div);
	uint32_t fractional_repr = (uint32_t)(
	    (fractional_part << 16) / frac_div);

	/* Success! */
	*result = (integer_part << 16) + fractional_repr;
	if (end != NULL) {
		*end = (char *)cur;
	}
	return false;
}